

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O1

int __thiscall
leveldb::InternalKeyComparator::Compare(InternalKeyComparator *this,Slice *akey,Slice *bkey)

{
  uint uVar1;
  char *local_30;
  long local_28;
  char *local_20;
  long local_18;
  
  if (7 < akey->size_) {
    local_30 = akey->data_;
    local_28 = akey->size_ - 8;
    if (7 < bkey->size_) {
      local_20 = bkey->data_;
      local_18 = bkey->size_ - 8;
      uVar1 = (*this->user_comparator_->_vptr_Comparator[2])(this->user_comparator_,&local_30);
      if (uVar1 == 0) {
        uVar1 = 0xffffffff;
        if (*(ulong *)(akey->data_ + (akey->size_ - 8)) <=
            *(ulong *)(bkey->data_ + (bkey->size_ - 8))) {
          uVar1 = (uint)(*(ulong *)(akey->data_ + (akey->size_ - 8)) <
                        *(ulong *)(bkey->data_ + (bkey->size_ - 8)));
        }
      }
      return uVar1;
    }
  }
  __assert_fail("internal_key.size() >= 8",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/dbformat.h"
                ,100,"Slice leveldb::ExtractUserKey(const Slice &)");
}

Assistant:

const char *InternalKeyComparator::Name() const {
        return "leveldb.InternalKeyComparator";
    }